

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

Vec_Wec_t * Str_ManDeriveTrees(Gia_Man_t *p)

{
  Vec_Wec_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  char *pStr;
  Vec_Int_t *pVVar5;
  bool bVar6;
  char *local_58;
  char *pTemp;
  int local_48;
  int fFound;
  int iStructId;
  int i;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Vec_Str_t *vStr;
  Vec_Wec_t *vGroups;
  Abc_Nam_t *pNames;
  Gia_Man_t *pGStack_10;
  int fPrintStructs;
  Gia_Man_t *p_local;
  
  pNames._4_4_ = 0;
  pGStack_10 = p;
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x171,"Vec_Wec_t *Str_ManDeriveTrees(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    pGStack_10->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGStack_10);
  for (fFound = 0; fFound < pGStack_10->nObjs; fFound = fFound + 1) {
    iVar1 = Gia_ObjIsMuxId(pGStack_10,fFound);
    if (iVar1 != 0) {
      pFanin = Gia_ManObj(pGStack_10,fFound);
      _iStructId = Gia_ObjFanin0(pFanin);
      iVar1 = Gia_ObjIsMux(pGStack_10,_iStructId);
      if ((iVar1 != 0) && (iVar1 = Gia_ObjRefNum(pGStack_10,_iStructId), iVar1 == 1)) {
        *(ulong *)_iStructId = *(ulong *)_iStructId & 0xffffffffbfffffff | 0x40000000;
      }
      _iStructId = Gia_ObjFanin1(pFanin);
      iVar1 = Gia_ObjIsMux(pGStack_10,_iStructId);
      if ((iVar1 != 0) && (iVar1 = Gia_ObjRefNum(pGStack_10,_iStructId), iVar1 == 1)) {
        *(ulong *)_iStructId = *(ulong *)_iStructId & 0xffffffffbfffffff | 0x40000000;
      }
    }
  }
  pObj = (Gia_Obj_t *)Vec_StrAlloc(1000);
  vGroups = (Vec_Wec_t *)Abc_NamStart(10000,0x32);
  vStr = (Vec_Str_t *)Vec_WecAlloc(1000);
  Vec_WecPushLevel((Vec_Wec_t *)vStr);
  fFound = 0;
  do {
    if (pGStack_10->nObjs <= fFound) {
      if (pNames._4_4_ != 0) {
        fFound = 1;
        while( true ) {
          iVar1 = fFound;
          iVar2 = Abc_NamObjNumMax((Abc_Nam_t *)vGroups);
          bVar6 = false;
          if (iVar1 < iVar2) {
            local_58 = Abc_NamStr((Abc_Nam_t *)vGroups,fFound);
            bVar6 = local_58 != (char *)0x0;
          }
          if (!bVar6) break;
          printf("%5d : ",(ulong)(uint)fFound);
          pVVar5 = Vec_WecEntry((Vec_Wec_t *)vStr,fFound);
          uVar3 = Vec_IntSize(pVVar5);
          printf("Occur = %4d   ",(ulong)uVar3);
          uVar3 = Str_ManMuxCountOne(local_58);
          printf("Size = %4d   ",(ulong)uVar3);
          printf("%s\n",local_58);
          fFound = fFound + 1;
        }
      }
      Abc_NamStop((Abc_Nam_t *)vGroups);
      Vec_StrFree((Vec_Str_t *)pObj);
      return (Vec_Wec_t *)vStr;
    }
    iVar1 = Gia_ObjIsMuxId(pGStack_10,fFound);
    if (((iVar1 != 0) &&
        (pFanin = Gia_ManObj(pGStack_10,fFound), (*(ulong *)pFanin >> 0x1e & 1) == 0)) &&
       ((pGVar4 = Gia_ObjFanin0(pFanin), (*(ulong *)pGVar4 >> 0x1e & 1) != 0 ||
        (pGVar4 = Gia_ObjFanin1(pFanin), (*(ulong *)pGVar4 >> 0x1e & 1) != 0)))) {
      Str_MuxStructDump(pGStack_10,pFanin,(Vec_Str_t *)pObj);
      p_00 = vGroups;
      pStr = Vec_StrArray((Vec_Str_t *)pObj);
      local_48 = Abc_NamStrFindOrAdd((Abc_Nam_t *)p_00,pStr,(int *)((long)&pTemp + 4));
      if (pTemp._4_4_ == 0) {
        Vec_WecPushLevel((Vec_Wec_t *)vStr);
      }
      iVar1 = Abc_NamObjNumMax((Abc_Nam_t *)vGroups);
      iVar2 = Vec_WecSize((Vec_Wec_t *)vStr);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_NamObjNumMax(pNames) == Vec_WecSize(vGroups)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                      ,0x191,"Vec_Wec_t *Str_ManDeriveTrees(Gia_Man_t *)");
      }
      pVVar5 = Vec_WecEntry((Vec_Wec_t *)vStr,local_48);
      Vec_IntPush(pVVar5,fFound);
    }
    fFound = fFound + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Str_ManDeriveTrees( Gia_Man_t * p )
{
    int fPrintStructs = 0;
    Abc_Nam_t * pNames; 
    Vec_Wec_t * vGroups;  
    Vec_Str_t * vStr;
    Gia_Obj_t * pObj, * pFanin;
    int i, iStructId, fFound;
    assert( p->pMuxes != NULL );
    // mark MUXes whose only fanout is a MUX
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    Gia_ManForEachMuxId( p, i )
    {
        pObj = Gia_ManObj(p, i);
        pFanin = Gia_ObjFanin0(pObj);
        if ( Gia_ObjIsMux(p, pFanin) && Gia_ObjRefNum(p, pFanin) == 1 )
            pFanin->fMark0 = 1;
        pFanin = Gia_ObjFanin1(pObj);
        if ( Gia_ObjIsMux(p, pFanin) && Gia_ObjRefNum(p, pFanin) == 1 )
            pFanin->fMark0 = 1;
    }
    // traverse for top level MUXes
    vStr   = Vec_StrAlloc( 1000 );
    pNames = Abc_NamStart( 10000, 50 );
    vGroups = Vec_WecAlloc( 1000 );
    Vec_WecPushLevel( vGroups );
    Gia_ManForEachMuxId( p, i )
    {
        // skip internal
        pObj = Gia_ManObj(p, i);
        if ( pObj->fMark0 )
            continue;
        // skip trees of size one
        if ( !Gia_ObjFanin0(pObj)->fMark0 && !Gia_ObjFanin1(pObj)->fMark0 )
            continue;
        // hash the tree
        Str_MuxStructDump( p, pObj, vStr );
        iStructId = Abc_NamStrFindOrAdd( pNames, Vec_StrArray(vStr), &fFound );
        if ( !fFound ) Vec_WecPushLevel( vGroups );
        assert( Abc_NamObjNumMax(pNames) == Vec_WecSize(vGroups) );
        Vec_IntPush( Vec_WecEntry(vGroups, iStructId), i );
    }
    if ( fPrintStructs )
    {
        char * pTemp; 
        Abc_NamManForEachObj( pNames, pTemp, i )
        {
            printf( "%5d : ", i );
            printf( "Occur = %4d   ", Vec_IntSize(Vec_WecEntry(vGroups,i)) );
            printf( "Size = %4d   ",  Str_ManMuxCountOne(pTemp) );
            printf( "%s\n", pTemp );
        }
    }
    Abc_NamStop( pNames );
    Vec_StrFree( vStr );
    return vGroups;
}